

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pPVar5;
  iterator iVar6;
  iterator iVar7;
  reference pbVar8;
  pointer pbVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__lhs;
  size_type sVar10;
  reference pvVar11;
  reference ppcVar12;
  char *__nptr;
  char *in_R8;
  static_string_view sVar13;
  string_view sVar14;
  string_view varg1;
  string_view varg1_00;
  string_view varg1_01;
  bool local_589;
  bool local_49d;
  undefined1 local_498 [4];
  int plevel;
  string parallel;
  undefined1 local_458 [8];
  ostringstream cmCTestLog_msg;
  cmCTestGenericHandler **handler;
  iterator __end2;
  iterator __begin2;
  vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *__range2;
  allocator<char> local_259;
  string local_258;
  string_view local_238;
  string_view local_228;
  undefined1 local_218 [8];
  string input;
  undefined1 local_1e8 [8];
  string targ;
  undefined1 local_1a8 [8];
  string arg;
  string errormsg_1;
  size_t i;
  string local_158;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> presetName_1;
  undefined1 local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> presetName;
  allocator<char> local_c9;
  string local_c8;
  byte local_a1;
  string local_a0 [7];
  bool success;
  string errormsg;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  byte local_34;
  bool local_33;
  byte local_32;
  byte local_31;
  bool listPresets;
  bool SRArgumentSpecified;
  bool executeTests;
  char *pcStack_30;
  bool cmakeAndTest;
  char *ctestExec;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTest *this_local;
  
  pcStack_30 = "ctest";
  local_31 = 0;
  local_32 = 1;
  local_33 = false;
  ctestExec = (char *)output;
  output_local = (string *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (&pPVar5->InitialCommandLineArguments,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)output_local);
  iVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)output_local);
  iVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)output_local);
  local_40 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[15]>
                       (iVar6._M_current,iVar7._M_current,(char (*) [15])"--list-presets");
  it._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)output_local);
  local_34 = __gnu_cxx::operator!=(&local_40,&it);
  iVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)output_local);
  iVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)output_local);
  local_60 = std::
             find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                       (iVar6._M_current,iVar7._M_current);
  local_49d = true;
  if ((local_34 & 1) == 0) {
    errormsg.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)output_local);
    local_49d = __gnu_cxx::operator!=
                          (&local_60,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&errormsg.field_2 + 8));
  }
  if (local_49d != false) {
    std::__cxx11::string::string(local_a0);
    if ((local_34 & 1) == 0) {
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_60);
      sVar14 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar8);
      presetName.field_2._8_8_ = sVar14._M_len;
      bVar2 = cmHasLiteralPrefix<10ul>(sVar14,(char (*) [10])"--preset=");
      if (bVar2) {
        pbVar9 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator->(&local_60);
        std::__cxx11::string::substr((ulong)local_110,(ulong)pbVar9);
        local_a1 = SetArgsFromPreset(this,(string *)local_110,(bool)(local_34 & 1));
        std::__cxx11::string::~string((string *)local_110);
      }
      else {
        __lhs = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_60);
        presetName_1.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)output_local);
        bVar2 = __gnu_cxx::operator!=
                          (__lhs,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&presetName_1.field_2 + 8));
        if (bVar2) {
          pbVar8 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_60);
          std::__cxx11::string::string((string *)local_138,(string *)pbVar8);
          local_a1 = SetArgsFromPreset(this,(string *)local_138,(bool)(local_34 & 1));
          std::__cxx11::string::~string((string *)local_138);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_158,"\'--preset\' requires an argument",
                     (allocator<char> *)((long)&i + 7));
          cmSystemTools::Error(&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
          local_a1 = 0;
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
      local_a1 = SetArgsFromPreset(this,&local_c8,(bool)(local_34 & 1));
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
    if ((local_34 & 1) == 0) {
      if ((local_a1 & 1) == 0) {
        this_local._4_4_ = 1;
        i._0_4_ = 1;
      }
      else {
        i._0_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = (uint)((local_a1 & 1) == 0);
      i._0_4_ = 1;
    }
    std::__cxx11::string::~string(local_a0);
    if ((int)i != 0) {
      return this_local._4_4_;
    }
  }
  errormsg_1.field_2._8_8_ = 1;
  do {
    uVar1 = errormsg_1.field_2._8_8_;
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)output_local);
    if (sVar10 <= (ulong)uVar1) {
      pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      if ((pPVar5->ParallelLevelSetInCli & 1U) == 0) {
        std::__cxx11::string::string((string *)local_498);
        bVar2 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",(string *)local_498);
        if (bVar2) {
          __nptr = (char *)std::__cxx11::string::c_str();
          iVar4 = atoi(__nptr);
          SetParallelLevel(this,iVar4);
        }
        std::__cxx11::string::~string((string *)local_498);
      }
      pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      local_589 = false;
      if ((pPVar5->TestProgressOutput & 1U) != 0) {
        pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pPVar5->OutputLogFile);
        local_589 = false;
        if (!bVar2) {
          local_589 = ProgressOutputSupportedByConsole();
        }
      }
      pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      pPVar5->TestProgressOutput = local_589;
      if ((local_31 & 1) == 0) {
        if ((local_32 & 1) == 0) {
          this_local._4_4_ = 1;
        }
        else {
          this_local._4_4_ = ExecuteTests(this);
        }
      }
      else {
        this_local._4_4_ = RunCMakeAndTest(this,(string *)ctestExec);
      }
      return this_local._4_4_;
    }
    std::__cxx11::string::string((string *)(arg.field_2._M_local_buf + 8));
    bVar2 = HandleCommandLineArguments
                      (this,(size_t *)(errormsg_1.field_2._M_local_buf + 8),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)output_local,(string *)(arg.field_2._M_local_buf + 8));
    if (bVar2) {
      HandleScriptArguments
                (this,(size_t *)(errormsg_1.field_2._M_local_buf + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)output_local,&local_33);
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)output_local,errormsg_1.field_2._8_8_);
      std::__cxx11::string::string((string *)local_1a8,(string *)pvVar11);
      sVar13 = ::cm::operator____s("-D",2);
      sVar14._M_len = sVar13.super_string_view._M_str;
      targ.field_2._8_8_ = sVar13.super_string_view._M_len;
      sVar14._M_str = "--dashboard";
      bVar3 = CheckArgument((cmCTest *)local_1a8,(string *)targ.field_2._8_8_,sVar14,in_R8);
      uVar1 = errormsg_1.field_2._8_8_;
      bVar2 = false;
      if (bVar3) {
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)output_local);
        bVar2 = (ulong)uVar1 < sVar10 - 1;
      }
      if (bVar2) {
        pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        pPVar5->ProduceXML = true;
        errormsg_1.field_2._8_8_ = errormsg_1.field_2._8_8_ + 1;
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)output_local,errormsg_1.field_2._8_8_);
        std::__cxx11::string::string((string *)local_1e8,(string *)pvVar11);
        bVar2 = AddTestsForDashboardType(this,(string *)local_1e8);
        if (!bVar2) {
          bVar2 = AddVariableDefinition(this,(string *)local_1e8);
          if (!bVar2) {
            ErrorMessageUnknownDashDValue(this,(string *)local_1e8);
            local_32 = 0;
          }
        }
        std::__cxx11::string::~string((string *)local_1e8);
      }
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1a8,"-D");
      if (bVar2) {
        sVar14 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1a8);
        input.field_2._8_8_ = sVar14._M_len;
        bVar2 = cmHasLiteralPrefix<3ul>(sVar14,(char (*) [3])0xd5a1c0);
        if (bVar2) {
          std::__cxx11::string::substr((ulong)local_218,(ulong)local_1a8);
          AddVariableDefinition(this,(string *)local_218);
          std::__cxx11::string::~string((string *)local_218);
        }
      }
      bVar2 = HandleTestActionArgument
                        (this,pcStack_30,(size_t *)(errormsg_1.field_2._M_local_buf + 8),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local);
      if (!bVar2) {
        local_32 = 0;
      }
      bVar2 = HandleTestModelArgument
                        (this,pcStack_30,(size_t *)(errormsg_1.field_2._M_local_buf + 8),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local);
      if (!bVar2) {
        local_32 = 0;
      }
      sVar14 = (string_view)::cm::operator____s("--extra-submit",0xe);
      varg1._M_len = sVar14._M_str;
      varg1._M_str = (char *)0x0;
      local_238 = sVar14;
      local_228 = sVar14;
      bVar3 = CheckArgument((cmCTest *)local_1a8,(string *)sVar14._M_len,varg1,in_R8);
      uVar1 = errormsg_1.field_2._8_8_;
      bVar2 = false;
      if (bVar3) {
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)output_local);
        bVar2 = (ulong)uVar1 < sVar10 - 1;
      }
      if (bVar2) {
        pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        pPVar5->ProduceXML = true;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"Submit",&local_259)
        ;
        SetTest(this,&local_258,true);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator(&local_259);
        errormsg_1.field_2._8_8_ = errormsg_1.field_2._8_8_ + 1;
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)output_local,errormsg_1.field_2._8_8_);
        bVar2 = SubmitExtraFiles(this,pvVar11);
        if (bVar2) goto LAB_0016da1f;
        this_local._4_4_ = 0;
        i._0_4_ = 1;
      }
      else {
LAB_0016da1f:
        sVar13 = ::cm::operator____s("--build-and-test",0x10);
        varg1_00._M_len = sVar13.super_string_view._M_str;
        varg1_00._M_str = (char *)0x0;
        bVar3 = CheckArgument((cmCTest *)local_1a8,(string *)sVar13.super_string_view._M_len,
                              varg1_00,in_R8);
        uVar1 = errormsg_1.field_2._8_8_;
        bVar2 = false;
        if (bVar3) {
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)output_local);
          bVar2 = (ulong)uVar1 < sVar10 - 1;
        }
        if (bVar2) {
          local_31 = 1;
        }
        sVar13 = ::cm::operator____s("--schedule-random",0x11);
        varg1_01._M_len = sVar13.super_string_view._M_str;
        varg1_01._M_str = (char *)0x0;
        bVar2 = CheckArgument((cmCTest *)local_1a8,(string *)sVar13.super_string_view._M_len,
                              varg1_01,in_R8);
        if (bVar2) {
          pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          std::__cxx11::string::operator=((string *)&pPVar5->ScheduleType,"Random");
        }
        pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        Private::GetTestingHandlers
                  ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                   &__begin2,pPVar5);
        __end2 = std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::
                 begin((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                       &__begin2);
        handler = (cmCTestGenericHandler **)
                  std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::
                  end((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                      &__begin2);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
                                      *)&handler);
          if (!bVar2) break;
          ppcVar12 = __gnu_cxx::
                     __normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
                     ::operator*(&__end2);
          iVar4 = (*(*ppcVar12)->_vptr_cmCTestGenericHandler[2])
                            (*ppcVar12,local_1a8,(undefined1 *)((long)&errormsg_1.field_2 + 8),
                             output_local);
          if (iVar4 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
            std::operator<<((ostream *)local_458,
                            "Problem parsing command line arguments within a handler");
            std::__cxx11::ostringstream::str();
            in_R8 = (char *)std::__cxx11::string::c_str();
            Log(this,7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                ,0xaca,in_R8,false);
            std::__cxx11::string::~string((string *)(parallel.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
            this_local._4_4_ = 0;
            i._0_4_ = 1;
            goto LAB_0016dd4b;
          }
          __gnu_cxx::
          __normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
          ::operator++(&__end2);
        }
        i._0_4_ = 5;
LAB_0016dd4b:
        std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::~vector
                  ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                   &__begin2);
        if ((int)i == 5) {
          i._0_4_ = 0;
        }
      }
      std::__cxx11::string::~string((string *)local_1a8);
    }
    else {
      cmSystemTools::Error((string *)((long)&arg.field_2 + 8));
      this_local._4_4_ = 1;
      i._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)(arg.field_2._M_local_buf + 8));
    if ((int)i != 0) {
      return this_local._4_4_;
    }
    errormsg_1.field_2._8_8_ = errormsg_1.field_2._8_8_ + 1;
  } while( true );
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  cm::append(this->Impl->InitialCommandLineArguments, args);

  // check if a test preset was specified

  bool listPresets =
    find(args.begin(), args.end(), "--list-presets") != args.end();
  auto it =
    std::find_if(args.begin(), args.end(), [](std::string const& arg) -> bool {
      return arg == "--preset" || cmHasLiteralPrefix(arg, "--preset=");
    });
  if (listPresets || it != args.end()) {
    std::string errormsg;
    bool success;

    if (listPresets) {
      // If listing presets we don't need a presetName
      success = this->SetArgsFromPreset("", listPresets);
    } else {
      if (cmHasLiteralPrefix(*it, "--preset=")) {
        auto presetName = it->substr(9);
        success = this->SetArgsFromPreset(presetName, listPresets);
      } else if (++it != args.end()) {
        auto presetName = *it;
        success = this->SetArgsFromPreset(presetName, listPresets);
      } else {
        cmSystemTools::Error("'--preset' requires an argument");
        success = false;
      }
    }

    if (listPresets) {
      return success ? 0 : 1;
    }

    if (!success) {
      return 1;
    }
  }

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg);
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D"_s, "--dashboard") &&
        i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmHasLiteralPrefix(arg, "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit"_s) && i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i])) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test"_s) &&
        i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random"_s)) {
      this->Impl->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but it may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      if (!handler->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->Impl->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // TestProgressOutput only supported if console supports it and not logging
  // to a file
  this->Impl->TestProgressOutput = this->Impl->TestProgressOutput &&
    !this->Impl->OutputLogFile && this->ProgressOutputSupportedByConsole();
#ifdef _WIN32
  if (this->Impl->TestProgressOutput) {
    // Disable output line buffering so we can print content without
    // a newline.
    std::setvbuf(stdout, nullptr, _IONBF, 0);
  }
#endif

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}